

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O1

DdNode * Cudd_zddSubset1(DdManager *dd,DdNode *P,int var)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddZddSubset1(dd,P,var);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_zddSubset1(
  DdManager * dd,
  DdNode * P,
  int  var)
{
    DdNode      *r;

    do {
        dd->reordered = 0;
        r = cuddZddSubset1(dd, P, var);
    } while (dd->reordered == 1);

    return(r);

}